

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O1

void __thiscall mjs::print_visitor::operator()(print_visitor *this,block_statement *s)

{
  wostream *pwVar1;
  long *plVar2;
  pointer puVar3;
  unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *bs;
  pointer puVar4;
  wchar_t local_20;
  wchar_t local_1c;
  
  pwVar1 = this->os_;
  plVar2 = *(long **)(pwVar1 + *(long *)(*(long *)pwVar1 + -0x18) + 0xf0);
  if (plVar2 != (long *)0x0) {
    local_20 = (**(code **)(*plVar2 + 0x50))(plVar2,0x7b);
    std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar1,&local_20,1);
    puVar3 = (s->l_).
             super__Vector_base<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar4 = (s->l_).
                  super__Vector_base<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar4 != puVar3; puVar4 = puVar4 + 1)
    {
      accept<mjs::print_visitor>
                ((puVar4->_M_t).
                 super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
                 super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
                 super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl,this);
    }
    pwVar1 = this->os_;
    plVar2 = *(long **)(pwVar1 + *(long *)(*(long *)pwVar1 + -0x18) + 0xf0);
    if (plVar2 != (long *)0x0) {
      local_1c = (**(code **)(*plVar2 + 0x50))(plVar2,0x7d);
      std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar1,&local_1c,1);
      return;
    }
  }
  std::__throw_bad_cast();
}

Assistant:

void operator()(const block_statement& s) {
        os_ << '{';
        for (const auto& bs: s.l()) {
            accept(*bs, *this);
        }
        os_ << '}';
    }